

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O0

error_info *
toml::make_error_info<std::__cxx11::string>
          (string *title,source_location *loc,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tail)

{
  error_info *in_RCX;
  string *in_RDX;
  source_location *in_RDI;
  error_info ei;
  source_location *in_stack_fffffffffffffde8;
  source_location *this;
  error_info *this_00;
  allocator<char> *in_stack_fffffffffffffe20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  error_info local_159;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  source_location *in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  error_info *in_stack_ffffffffffffff40;
  
  this = in_RDI;
  std::__cxx11::string::string(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  source_location::source_location(this,in_stack_fffffffffffffde8);
  std::__cxx11::string::string(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  this_00 = &local_159;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe30,(char *)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  error_info::error_info
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  source_location::~source_location(this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  error_info::error_info(this_00,in_RCX);
  std::__cxx11::string::string(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  detail::make_error_info_rec(in_RCX,in_RDX);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  error_info::~error_info((error_info *)this);
  error_info::~error_info((error_info *)this);
  return (error_info *)in_RDI;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}